

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_libmeshb_block.c
# Opt level: O1

int main(void)

{
  undefined4 uVar1;
  undefined8 uVar2;
  int64_t iVar3;
  ulong uVar4;
  void *pvVar5;
  void *pvVar6;
  void *__ptr;
  undefined4 *puVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  int dim;
  int ver;
  long local_98;
  void *local_90;
  int64_t local_88;
  long local_80;
  void *local_78;
  void *local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  void *local_40;
  void *local_38;
  
  iVar9 = 1;
  iVar3 = GmfOpenMesh("../sample_meshes/quad.meshb",1,&ver,&dim);
  if (iVar3 != 0) {
    printf("InpMsh : idx = %ld, version = %d, dimension = %d\n",iVar3,(ulong)(uint)ver,
           (ulong)(uint)dim);
    if (dim != 3) {
      exit(1);
    }
    uVar4 = GmfStatKwd(iVar3,4);
    printf("InpMsh : nmb vertices = %d\n",uVar4 & 0xffffffff);
    pvVar5 = malloc((long)((int)uVar4 * 3 + 3) << 2);
    lVar10 = (long)(int)uVar4;
    pvVar6 = malloc(lVar10 * 4 + 4);
    uVar4 = GmfStatKwd(iVar3,7);
    iVar11 = (int)uVar4;
    local_88 = iVar3;
    printf("InpMsh : nmb quads = %d\n",uVar4 & 0xffffffff);
    __ptr = malloc((long)(iVar11 * 5 + 5) << 2);
    local_78 = malloc((long)(iVar11 * 8 + 8) << 2);
    lVar8 = (long)pvVar5 + 0xc;
    local_90 = (void *)((long)pvVar5 + lVar10 * 0xc);
    local_98 = (long)pvVar5 + 0x10;
    local_50 = (long)pvVar5 + lVar10 * 0xc + 4;
    local_58 = (long)pvVar5 + 0x14;
    local_60 = (long)pvVar5 + lVar10 * 0xc + 8;
    local_68 = (long)pvVar6 + 4;
    local_70 = (void *)((long)pvVar6 + lVar10 * 4);
    local_80 = lVar8;
    local_48 = lVar10;
    local_40 = pvVar5;
    local_38 = pvVar6;
    GmfGetBlock(local_88,4,1,lVar10,0,(void *)0x0,(void *)0x0,8,lVar8,local_90,8,local_98,local_50,8
                ,local_58,local_60,10,local_68,local_70);
    iVar3 = local_88;
    GmfGetBlock(local_88,7,1,(long)iVar11,0,(void *)0x0,(void *)0x0,0xe,5,(long)__ptr + 0x14,
                (void *)((long)__ptr + (long)iVar11 * 0x14));
    GmfCloseMesh(iVar3);
    if (0 < iVar11) {
      puVar7 = (undefined4 *)((long)local_78 + 0x2c);
      lVar10 = 0x14;
      do {
        uVar2 = *(undefined8 *)((long)__ptr + lVar10);
        *(undefined8 *)(puVar7 + -7) = uVar2;
        uVar1 = *(undefined4 *)((long)__ptr + lVar10 + 0x10);
        puVar7[-4] = uVar1;
        puVar7[-3] = (int)uVar2;
        uVar2 = *(undefined8 *)((long)__ptr + lVar10 + 8);
        puVar7[-5] = (int)uVar2;
        *(undefined8 *)(puVar7 + -2) = uVar2;
        *puVar7 = uVar1;
        puVar7 = puVar7 + 8;
        lVar10 = lVar10 + 0x14;
      } while ((ulong)(iVar11 + 1) * 0x14 != lVar10);
    }
    iVar3 = GmfOpenMesh("tri.meshb",2,(ulong)(uint)ver,(ulong)(uint)dim);
    lVar10 = local_48;
    iVar9 = 1;
    if (iVar3 != 0) {
      GmfSetKwd(iVar3,4,local_48);
      GmfSetBlock(iVar3,4,1,lVar10,0,(void *)0x0,(void *)0x0,8,lVar8,local_90,8,local_98,local_50,8,
                  local_58,local_60,10,local_68,local_70);
      lVar10 = (long)(iVar11 * 2);
      GmfSetKwd(iVar3,6,lVar10);
      pvVar5 = local_78;
      local_88 = (long)local_78 + 0x10;
      lVar8 = lVar10 * 0x10;
      local_90 = (void *)((long)local_78 + lVar8);
      local_98 = (long)local_78 + 0x14;
      local_80 = (long)local_78 + lVar8 + 4;
      GmfSetBlock(iVar3,6,1,lVar10,0,(void *)0x0,(void *)0x0,10,local_88,local_90,10,local_98,
                  local_80,10,(long)local_78 + 0x18,(long)local_78 + lVar8 + 8,10,
                  (long)local_78 + 0x1c,(long)local_78 + lVar8 + 0xc);
      GmfCloseMesh(iVar3);
      printf("OutMsh : nmb triangles = %d\n",(ulong)(uint)(iVar11 * 2));
      free(__ptr);
      free(pvVar5);
      free(local_38);
      free(local_40);
      iVar9 = 0;
    }
  }
  return iVar9;
}

Assistant:

int main()
{
   int   i, NmbVer, NmbQad, ver, dim, *RefTab, (*QadTab)[5], (*TriTab)[4];
   //int   TypTab[ GmfMaxTyp ], SizTab[ GmfMaxTyp ];
   //void *BegTab[ GmfMaxTyp ], *EndTab[ GmfMaxTyp ];
   int64_t InpMsh, OutMsh;
   float (*VerTab)[3];


   /*-----------------------------------*/
   /* Open mesh file "quad.meshb"       */
   /*-----------------------------------*/

   if(!(InpMsh = GmfOpenMesh("../sample_meshes/quad.meshb", GmfRead, &ver, &dim)))
      return(1);

   printf("InpMsh : idx = "INT64_T_FMT", version = %d, dimension = %d\n", InpMsh, ver, dim);

   if(dim != 3)
      exit(1);

   // Read the number of vertices and allocate memory
   NmbVer = (int)GmfStatKwd(InpMsh, GmfVertices);
   printf("InpMsh : nmb vertices = %d\n", NmbVer);
   VerTab = malloc((NmbVer+1) * 3 * sizeof(float));
   RefTab = malloc((NmbVer+1) * sizeof(int));

   // Read the number of quads and allocate memory
   NmbQad = (int)GmfStatKwd(InpMsh, GmfQuadrilaterals);
   printf("InpMsh : nmb quads = %d\n", NmbQad);
   QadTab = malloc((NmbQad+1) * 5 * sizeof(int));
   TriTab = malloc((NmbQad+1) * 2 * 4 * sizeof(int));

   // Read the vertices: choose one of the four available methods

   // First method: argument list with scalar pointers
   GmfGetBlock(InpMsh, GmfVertices, 1, NmbVer, 0, NULL, NULL,
            GmfFloat, &VerTab[1][0], &VerTab[ NmbVer ][0],
            GmfFloat, &VerTab[1][1], &VerTab[ NmbVer ][1],
            GmfFloat, &VerTab[1][2], &VerTab[ NmbVer ][2],
            GmfInt,   &RefTab[1],    &RefTab[ NmbVer ] );

   // 2nd method: argument list with vector pointers
   /*GmfGetBlock(InpMsh, GmfVertices, 1, NmbVer, 0, NULL, NULL,
               GmfFloatVec, 3, &VerTab[1][0], &VerTab[ NmbVer ][0],
               GmfInt,         &RefTab[1],    &RefTab[ NmbVer ] );*/

   // 3rd method: argument table with scalar pointers
   /*TypTab[0] = GmfFloat;
   BegTab[0] = (void *)&VerTab[      1 ][0];
   EndTab[0] = (void *)&VerTab[ NmbVer ][0];

   TypTab[1] = GmfFloat;
   BegTab[1] = (void *)&VerTab[      1 ][1];
   EndTab[1] = (void *)&VerTab[ NmbVer ][1];

   TypTab[2] = GmfFloat;
   BegTab[2] = (void *)&VerTab[      1 ][2];
   EndTab[2] = (void *)&VerTab[ NmbVer ][2];

   TypTab[3] = GmfInt;
   BegTab[3] = (void *)&RefTab[      1 ];
   EndTab[3] = (void *)&RefTab[ NmbVer ];

   GmfGetBlock(InpMsh, GmfVertices, 1, NmbVer, 0, NULL, NULL,
               GmfArgTab, TypTab, SizTab, BegTab, EndTab );*/

   // 4th method: argument table with vector pointers
   /*TypTab[0] = GmfFloatVec;
   SizTab[0] = 3;
   BegTab[0] = (void *)&VerTab[      1 ][0];
   EndTab[0] = (void *)&VerTab[ NmbVer ][0];

   TypTab[1] = GmfInt;
   BegTab[1] = (void *)&RefTab[      1 ];
   EndTab[1] = (void *)&RefTab[ NmbVer ];

   GmfGetBlock(InpMsh, GmfVertices, 1, NmbVer, 0, NULL, NULL,
               GmfArgTab, TypTab, SizTab, BegTab, EndTab );*/

   // Read the quads
   GmfGetBlock(InpMsh, GmfQuadrilaterals, 1, NmbQad, 0, NULL, NULL,
               GmfIntVec, 5, &QadTab[1][0], &QadTab[ NmbQad ][0]);

   // Close the quad mesh
   GmfCloseMesh(InpMsh);


   /*-----------------------------------*/
   /* Create the triangluated mesh      */
   /*-----------------------------------*/

   for(i=1;i<=NmbQad;i++)
   {
      TriTab[i*2-1][0] = QadTab[i][0];
      TriTab[i*2-1][1] = QadTab[i][1];
      TriTab[i*2-1][2] = QadTab[i][2];
      TriTab[i*2-1][3] = QadTab[i][4];

      TriTab[i*2][0] = QadTab[i][0];
      TriTab[i*2][1] = QadTab[i][2];
      TriTab[i*2][2] = QadTab[i][3];
      TriTab[i*2][3] = QadTab[i][4];
   }


   /*-----------------------------------*/
   /* Write the triangle mesh           */
   /*-----------------------------------*/

   if(!(OutMsh = GmfOpenMesh("tri.meshb", GmfWrite, ver, dim)))
      return(1);

   // Write the vertices
   GmfSetKwd(OutMsh, GmfVertices, NmbVer);
   GmfSetBlock(OutMsh, GmfVertices, 1, NmbVer, 0, NULL, NULL,
               GmfFloat, &VerTab[1][0], &VerTab[ NmbVer ][0],
               GmfFloat, &VerTab[1][1], &VerTab[ NmbVer ][1],
               GmfFloat, &VerTab[1][2], &VerTab[ NmbVer ][2],
               GmfInt,   &RefTab[1],    &RefTab[ NmbVer ] );

   // Write the triangles
   GmfSetKwd(OutMsh, GmfTriangles, 2*NmbQad);
   GmfSetBlock(OutMsh, GmfTriangles, 1, 2*NmbQad, 0, NULL, NULL,
               GmfInt, &TriTab[1][0], &TriTab[ 2*NmbQad ][0],
               GmfInt, &TriTab[1][1], &TriTab[ 2*NmbQad ][1],
               GmfInt, &TriTab[1][2], &TriTab[ 2*NmbQad ][2],
               GmfInt, &TriTab[1][3], &TriTab[ 2*NmbQad ][3] );

   // Do not forget to close the mesh file
   GmfCloseMesh(OutMsh);
   printf("OutMsh : nmb triangles = %d\n", 2*NmbQad);

   free(QadTab);
   free(TriTab);
   free(RefTab);
   free(VerTab);

   return(0);
}